

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp.cpp
# Opt level: O1

BeliefUpperBound * __thiscall
despot::BeliefMDP::CreateBeliefUpperBound(BeliefMDP *this,string *name)

{
  int iVar1;
  TrivialBeliefUpperBound *this_00;
  ostream *poVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported belief upper bound: ");
      poVar2 = std::operator<<(poVar2,(string *)name);
      std::endl<char,std::char_traits<char>>(poVar2);
      exit(1);
    }
  }
  this_00 = (TrivialBeliefUpperBound *)operator_new(0x10);
  TrivialBeliefUpperBound::TrivialBeliefUpperBound(this_00,&this->super_DSPOMDP);
  return &this_00->super_BeliefUpperBound;
}

Assistant:

BeliefUpperBound* BeliefMDP::CreateBeliefUpperBound(string name) const {
	if (name == "TRIVIAL" || name == "DEFAULT") {
		return new TrivialBeliefUpperBound(this);
	} else {
		cerr << "Unsupported belief upper bound: " << name << endl;
		exit(1);
		return NULL;
	}
}